

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.cpp
# Opt level: O0

string * __thiscall
pbrt::TrowbridgeReitzDistribution::ToString_abi_cxx11_(TrowbridgeReitzDistribution *this)

{
  string *in_RDI;
  float *in_stack_00000010;
  char *in_stack_00000018;
  
  StringPrintf<float_const&,float_const&>(in_stack_00000018,in_stack_00000010,&this->alpha_x);
  return in_RDI;
}

Assistant:

std::string TrowbridgeReitzDistribution::ToString() const {
    return StringPrintf("[ TrowbridgeReitzDistribution alpha_x: %f alpha_y: %f ]",
                        alpha_x, alpha_y);
}